

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testDefaultOptionalValueZeroIfNotSet(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *pCVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  Type *pTVar8;
  StackLayerParams *this_01;
  LogMessage *other;
  undefined8 *puVar9;
  ostream *poVar10;
  int iVar11;
  int iVar12;
  Model m;
  LogFinisher local_89;
  undefined1 local_88 [56];
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_88 + 0x10;
  local_88._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"input1","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar2) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pAVar7->datatype_ = 0x10020;
  pRVar1 = &pAVar7->shape_;
  iVar12 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 3;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 5;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar12 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_88._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar2) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  pFVar6->isoptional_ = true;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pAVar7->datatype_ = 0x20020;
  pRVar1 = &pAVar7->shape_;
  iVar12 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 3;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 5;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar12 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_88._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar2) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pAVar7->datatype_ = 0x10020;
  pRVar1 = &pAVar7->shape_;
  iVar12 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 3;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 5;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar12 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 1;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_50.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar8->rank_ = 3;
  if (this_00->_oneof_case_[0] != 0x39d) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x39d;
    this_01 = (StackLayerParams *)operator_new(0x20);
    CoreML::Specification::StackLayerParams::StackLayerParams(this_01);
    (this_00->layer_).stack_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  (pCVar3->kernelsize_).current_size_ = 2;
  (pCVar3->kernelsize_).total_size_ = 0;
  local_50.specificationversion_ = 5;
  pMVar4 = local_50.description_;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  if ((pMVar4->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
  }
  puVar9 = *(undefined8 **)(*(long *)((pMVar4->input_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x20);
  if (puVar9 == (undefined8 *)0x0) {
    puVar9 = &CoreML::Specification::_FeatureType_default_instance_;
  }
  if (*(int *)((long)puVar9 + 0x24) == 5) {
    pAVar7 = (ArrayFeatureType *)puVar9[3];
  }
  else {
    pAVar7 = CoreML::Specification::ArrayFeatureType::default_instance();
  }
  iVar12 = 0;
  if ((pAVar7->_oneof_case_[1] == 0x29) &&
     (iVar12 = 0, (pAVar7->defaultOptionalValue_).intdefaultvalue_ != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x125);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"m.description().input(1).type().multiarraytype().intdefaultvalue() == 0",
               0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    iVar12 = 1;
    std::ostream::flush();
  }
  CoreML::Specification::Model::~Model(&local_50);
  return iVar12;
}

Assistant:

int testDefaultOptionalValueZeroIfNotSet() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);

    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto type = in2->mutable_type();
    type->set_isoptional(true);
    auto arr = type->mutable_multiarraytype();
    arr->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_INT32);
    // Not set default value which should raise error!

    arr->add_shape(3);
    arr->add_shape(5);
    arr->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(2);

    m.set_specificationversion(5);
    ML_ASSERT(m.description().input(1).type().multiarraytype().intdefaultvalue() == 0);
    return 0;
}